

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O1

void __thiscall BRTS<UF>::PerformLabeling(BRTS<UF> *this)

{
  ushort uVar1;
  ushort uVar2;
  uint height;
  uint uVar3;
  int iVar4;
  Mat1b *pMVar5;
  int *piVar6;
  Mat1i *pMVar7;
  long lVar8;
  uint *puVar9;
  uint uVar10;
  int iVar11;
  uint64_t *puVar12;
  Run *pRVar13;
  long lVar14;
  ulong uVar15;
  Run *pRVar16;
  ulong uVar17;
  Mat aMStack_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  height = *(uint *)&pMVar5->field_0x8;
  uVar3 = *(uint *)&pMVar5->field_0xc;
  (this->data_compressed).height = height;
  (this->data_compressed).width = uVar3;
  uVar10 = uVar3 + 0x3f;
  if (-1 < (int)uVar3) {
    uVar10 = uVar3;
  }
  iVar11 = ((int)uVar10 >> 6) + 1;
  (this->data_compressed).data_width = iVar11;
  iVar11 = iVar11 * height;
  uVar15 = 0xffffffffffffffff;
  if (-1 < iVar11) {
    uVar15 = (long)iVar11 * 8;
  }
  puVar12 = (uint64_t *)operator_new__(uVar15);
  (this->data_compressed).bits = puVar12;
  InitCompressedData(this,&this->data_compressed);
  (this->data_runs).height = height;
  (this->data_runs).width = uVar3;
  pRVar13 = (Run *)operator_new__((ulong)(((uVar3 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar13;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar11 = *(int *)&pMVar5->field_0x8;
  iVar4 = *(int *)&pMVar5->field_0xc;
  UF::P_ = (uint *)operator_new__((ulong)(((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) *
                                          ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *UF::P_ = 0;
  UF::length_ = 1;
  FindRuns(this,(this->data_compressed).bits,height,(this->data_compressed).data_width,pRVar13);
  pRVar13 = (this->data_runs).runs;
  piVar6 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(aMStack_b8,*piVar6,piVar6[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(aMStack_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     aMStack_b8);
  cv::Mat::~Mat(aMStack_b8);
  if (0 < (int)height) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar14 = *(long *)&pMVar7->field_0x10;
    lVar8 = **(long **)&pMVar7->field_0x48;
    uVar15 = 0;
    puVar9 = UF::P_;
    do {
      do {
        uVar1 = pRVar13->start_pos;
        uVar17 = (ulong)uVar1;
        if (uVar17 == 0xffff) {
          pRVar16 = pRVar13 + 1;
        }
        else {
          uVar2 = pRVar13->end_pos;
          pRVar16 = pRVar13;
          if (uVar1 < uVar2) {
            uVar3 = puVar9[pRVar13->label];
            do {
              *(uint *)(lVar14 + uVar17 * 4) = uVar3;
              uVar17 = uVar17 + 1;
            } while (uVar2 != uVar17);
          }
        }
        pRVar13 = pRVar16 + 1;
      } while (uVar1 != 0xffff);
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + lVar8;
      pRVar13 = pRVar16;
      puVar9 = UF::P_;
    } while (uVar15 != height);
  }
  if (UF::P_ != (uint *)0x0) {
    operator_delete__(UF::P_);
  }
  pRVar13 = (this->data_runs).runs;
  if (pRVar13 != (Run *)0x0) {
    operator_delete__(pRVar13);
  }
  puVar12 = (this->data_compressed).bits;
  if (puVar12 != (uint64_t *)0x0) {
    operator_delete__(puVar12);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        img_labels_ = cv::Mat1i(img_.size(), 0); // (0-init)
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }